

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLCellLinOp.cpp
# Opt level: O1

void __thiscall
amrex::MLCellLinOp::compFlux
          (MLCellLinOp *this,int amrlev,Array<MultiFab_*,_3> *fluxes,MultiFab *sol,Location loc)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  FArrayBox *pFVar5;
  uint N;
  DataAllocator DVar6;
  int *piVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  BaseFab<double> *this_00;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  Box bx;
  undefined4 uStack_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  long local_270;
  MFItInfo mfi_info;
  Box local_200;
  Box local_1e4;
  Array<FArrayBox_*,_3> pflux;
  Elixir elifz;
  Elixir elify;
  Elixir elifx;
  MFIter mfi;
  Array<FArrayBox,_3> flux;
  
  N = (*(this->super_MLLinOp)._vptr_MLLinOp[5])();
  lVar12 = 0;
  (*(this->super_MLLinOp)._vptr_MLLinOp[0x47])
            (this,(long)amrlev,0,sol,1,0,
             (tuple<amrex::MLMGBndry_*,_std::default_delete<amrex::MLMGBndry>_>)
             (this->m_bndry_sol).
             super_vector<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,_std::allocator<std::unique_ptr<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[amrlev]._M_t.
             super___uniq_ptr_impl<amrex::MLMGBndry,_std::default_delete<amrex::MLMGBndry>_>,0);
  mfi_info.num_streams = Gpu::Device::max_gpu_streams;
  mfi_info.do_tiling = true;
  mfi_info.tilesize.vect[0] = (int)FabArrayBase::mfiter_tile_size;
  mfi_info.tilesize.vect[1] = FabArrayBase::mfiter_tile_size._4_4_;
  mfi_info.tilesize.vect[2] = DAT_00753ec0;
  mfi_info.dynamic = true;
  mfi_info.device_sync = true;
  do {
    FArrayBox::FArrayBox
              ((FArrayBox *)
               ((long)(&flux._M_elems[0].super_BaseFab<double>.domain.smallend + -2) + lVar12));
    lVar12 = lVar12 + 0x48;
  } while (lVar12 != 0xd8);
  pflux._M_elems[0] = flux._M_elems;
  pflux._M_elems[1] = flux._M_elems + 1;
  pflux._M_elems[2] = flux._M_elems + 2;
  MFIter::MFIter(&mfi,(FabArrayBase *)sol,&mfi_info);
  if (mfi.currentIndex < mfi.endIndex) {
    do {
      MFIter::tilebox(&local_1e4,&mfi);
      bx.bigend.vect[2] = local_1e4.bigend.vect[2];
      bx.btype.itype = local_1e4.btype.itype;
      bx.smallend.vect[0] = local_1e4.smallend.vect[0];
      bx.smallend.vect[1] = local_1e4.smallend.vect[1];
      bx.bigend.vect[0] = local_1e4.bigend.vect[0];
      if ((local_1e4._20_8_ & 0x100000000) == 0) {
        bx.bigend.vect[0] = local_1e4.bigend.vect[0] + 1;
        bx.btype.itype = bx.btype.itype | 1;
      }
      FArrayBox::resize(flux._M_elems,&bx,N,(Arena *)0x0);
      bx.bigend.vect[1] = local_1e4.bigend.vect[1];
      bx.bigend.vect[2] = local_1e4.bigend.vect[2];
      bx.btype.itype = local_1e4.btype.itype;
      bx.smallend.vect[0] = local_1e4.smallend.vect[0];
      bx.smallend.vect[1] = local_1e4.smallend.vect[1];
      if ((local_1e4._20_8_ & 0x200000000) == 0) {
        bx.bigend.vect[1] = local_1e4.bigend.vect[1] + 1;
        bx.btype.itype = bx.btype.itype | 2;
      }
      FArrayBox::resize(flux._M_elems + 1,&bx,N,(Arena *)0x0);
      bx.bigend.vect[1] = local_1e4.bigend.vect[1];
      bx.bigend.vect[2] = local_1e4.bigend.vect[2];
      bx.btype.itype = local_1e4.btype.itype;
      bx.smallend.vect[0] = local_1e4.smallend.vect[0];
      bx.smallend.vect[1] = local_1e4.smallend.vect[1];
      bx.smallend.vect[2] = local_1e4.smallend.vect[2];
      bx.bigend.vect[0] = local_1e4.bigend.vect[0];
      if ((local_1e4._20_8_ & 0x400000000) == 0) {
        bx.bigend.vect[2] = bx.bigend.vect[2] + 1;
        bx.btype.itype = bx.btype.itype | 4;
      }
      FArrayBox::resize(flux._M_elems + 2,&bx,N,(Arena *)0x0);
      DVar6 = flux._M_elems[0].super_BaseFab<double>.super_DataAllocator;
      if (flux._M_elems[0].super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        DVar6.m_arena = The_Arena();
      }
      Gpu::Elixir::Elixir(&elifx,(void *)0x0,DVar6.m_arena);
      DVar6 = flux._M_elems[1].super_BaseFab<double>.super_DataAllocator;
      if (flux._M_elems[1].super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        DVar6.m_arena = The_Arena();
      }
      Gpu::Elixir::Elixir(&elify,(void *)0x0,DVar6.m_arena);
      DVar6 = flux._M_elems[2].super_BaseFab<double>.super_DataAllocator;
      if (flux._M_elems[2].super_BaseFab<double>.super_DataAllocator.m_arena == (Arena *)0x0) {
        DVar6.m_arena = The_Arena();
      }
      Gpu::Elixir::Elixir(&elifz,(void *)0x0,DVar6.m_arena);
      piVar7 = &mfi.currentIndex;
      if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
        piVar7 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                 super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_start + mfi.currentIndex;
      }
      (*(this->super_MLLinOp)._vptr_MLLinOp[0x4a])
                (this,(ulong)(uint)amrlev,&mfi,&pflux,
                 (sol->super_FabArray<amrex::FArrayBox>).m_fabs_v.
                 super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>._M_impl
                 .super__Vector_impl_data._M_start[*piVar7],(ulong)loc,0);
      lVar12 = 0;
      do {
        MFIter::nodaltilebox(&local_200,&mfi,(int)lVar12);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&bx,&fluxes->_M_elems[lVar12]->super_FabArray<amrex::FArrayBox>
                   ,&mfi);
        if (0 < (int)N) {
          pFVar5 = pflux._M_elems[lVar12];
          iVar1 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[0];
          iVar2 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[1];
          iVar3 = (pFVar5->super_BaseFab<double>).domain.smallend.vect[2];
          iVar4 = (pFVar5->super_BaseFab<double>).domain.bigend.vect[2];
          lVar8 = (long)(((pFVar5->super_BaseFab<double>).domain.bigend.vect[0] - iVar1) + 1);
          lVar13 = (long)(((pFVar5->super_BaseFab<double>).domain.bigend.vect[1] - iVar2) + 1);
          lVar9 = (long)local_200.smallend.vect[1];
          lVar16 = (lVar9 * 8 + ((long)local_200.smallend.vect[2] - (long)iVar3) * lVar13 * 8 +
                   (long)iVar2 * -8) * lVar8 + (long)local_200.smallend.vect[0] * 8 +
                   (long)iVar1 * -8 + (long)(pFVar5->super_BaseFab<double>).dptr;
          lVar13 = lVar13 * lVar8 * 8;
          local_270 = 0;
          uVar11 = 0;
          do {
            lVar15 = lVar16;
            lVar20 = (long)local_200.smallend.vect[2];
            if (local_200.smallend.vect[2] <= local_200.bigend.vect[2]) {
              do {
                if (local_200.smallend.vect[1] <= local_200.bigend.vect[1]) {
                  lVar10 = CONCAT44(bx.bigend.vect[0],bx.smallend.vect[2]) * 8;
                  lVar14 = CONCAT44(uStack_2ac,bx.btype.itype) * local_270 +
                           (lVar9 - local_2a4) * lVar10 +
                           (lVar20 - local_2a0) * CONCAT44(bx.bigend.vect[2],bx.bigend.vect[1]) * 8
                           + (long)local_2a8 * -8 +
                           bx.smallend.vect._0_8_ + (long)local_200.smallend.vect[0] * 8;
                  lVar18 = lVar9;
                  lVar19 = lVar15;
                  do {
                    if (local_200.smallend.vect[0] <= local_200.bigend.vect[0]) {
                      lVar17 = 0;
                      do {
                        *(undefined8 *)(lVar14 + lVar17 * 8) = *(undefined8 *)(lVar19 + lVar17 * 8);
                        lVar17 = lVar17 + 1;
                      } while ((local_200.bigend.vect[0] - local_200.smallend.vect[0]) + 1 !=
                               (int)lVar17);
                    }
                    lVar18 = lVar18 + 1;
                    lVar19 = lVar19 + lVar8 * 8;
                    lVar14 = lVar14 + lVar10;
                  } while (local_200.bigend.vect[1] + 1 != (int)lVar18);
                }
                lVar20 = lVar20 + 1;
                lVar15 = lVar15 + lVar13;
              } while (local_200.bigend.vect[2] + 1 != (int)lVar20);
            }
            uVar11 = uVar11 + 1;
            lVar16 = lVar16 + ((iVar4 - iVar3) + 1) * lVar13;
            local_270 = local_270 + 8;
          } while (uVar11 != N);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      Gpu::Elixir::~Elixir(&elifz);
      Gpu::Elixir::~Elixir(&elify);
      Gpu::Elixir::~Elixir(&elifx);
      MFIter::operator++(&mfi);
    } while (mfi.currentIndex < mfi.endIndex);
  }
  MFIter::~MFIter(&mfi);
  lVar12 = 0x90;
  do {
    this_00 = (BaseFab<double> *)
              ((long)(&flux._M_elems[0].super_BaseFab<double>.domain.smallend + -2) + lVar12);
    this_00->_vptr_BaseFab = (_func_int **)&PTR__BaseFab_0074eb90;
    BaseFab<double>::clear(this_00);
    lVar12 = lVar12 + -0x48;
  } while (lVar12 != -0x48);
  return;
}

Assistant:

void
MLCellLinOp::compFlux (int amrlev, const Array<MultiFab*,AMREX_SPACEDIM>& fluxes,
                       MultiFab& sol, Location loc) const
{
    BL_PROFILE("MLCellLinOp::compFlux()");

    const int mglev = 0;
    const int ncomp = getNComp();
    applyBC(amrlev, mglev, sol, BCMode::Inhomogeneous, StateMode::Solution,
            m_bndry_sol[amrlev].get());

    MFItInfo mfi_info;
    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    {
        Array<FArrayBox,AMREX_SPACEDIM> flux;
        Array<FArrayBox*,AMREX_SPACEDIM> pflux {{ AMREX_D_DECL(&flux[0], &flux[1], &flux[2]) }};
        for (MFIter mfi(sol, mfi_info);  mfi.isValid(); ++mfi)
        {
            const Box& tbx = mfi.tilebox();
            AMREX_D_TERM(flux[0].resize(amrex::surroundingNodes(tbx,0),ncomp);,
                         flux[1].resize(amrex::surroundingNodes(tbx,1),ncomp);,
                         flux[2].resize(amrex::surroundingNodes(tbx,2),ncomp););
            AMREX_D_TERM(Elixir elifx = flux[0].elixir();,
                         Elixir elify = flux[1].elixir();,
                         Elixir elifz = flux[2].elixir(););
            FFlux(amrlev, mfi, pflux, sol[mfi], loc);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                const Box& nbx = mfi.nodaltilebox(idim);
                Array4<Real      > dst = fluxes[idim]->array(mfi);
                Array4<Real const> src =  pflux[idim]->array();
                AMREX_HOST_DEVICE_PARALLEL_FOR_4D (nbx, ncomp, i, j, k, n,
                {
                    dst(i,j,k,n) = src(i,j,k,n);
                });
            }
        }
    }
}